

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall tf::Runtime::corun(Runtime *this)

{
  long in_RDI;
  Node *in_stack_00000010;
  anon_class_8_1_8991fb9c *in_stack_00000020;
  AnchorGuard anchor;
  AnchorGuard local_10 [2];
  
  AnchorGuard::AnchorGuard(local_10,*(Node **)(in_RDI + 0x10));
  Executor::_corun_until<tf::Runtime::corun()::_lambda()_1_>
            ((Executor *)this,(Worker *)anchor._node,in_stack_00000020);
  AnchorGuard::~AnchorGuard(local_10);
  Node::_rethrow_exception(in_stack_00000010);
  return;
}

Assistant:

inline void Runtime::corun() {
  {
    AnchorGuard anchor(_parent);
    _executor._corun_until(_worker, [this] () -> bool {
      return _parent->_join_counter.load(std::memory_order_acquire) == 0;
    });
  }
  _parent->_rethrow_exception();
}